

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

void __thiscall MutableS2ShapeIndex::InteriorTracker::InteriorTracker(InteriorTracker *this)

{
  S2CellId SVar1;
  
  this->is_active_ = false;
  (this->a_).c_[0] = 0.0;
  (this->a_).c_[1] = 0.0;
  (this->a_).c_[2] = 0.0;
  Origin();
  SVar1 = S2CellId::Begin(0x1e);
  (this->next_cellid_).id_ = SVar1.id_;
  (this->crosser_).a_cross_b_.c_[2] = 0.0;
  (this->crosser_).a_cross_b_.c_[0] = 0.0;
  (this->crosser_).a_cross_b_.c_[1] = 0.0;
  (this->crosser_).a_tangent_.c_[0] = 0.0;
  (this->crosser_).a_tangent_.c_[1] = 0.0;
  (this->crosser_).a_tangent_.c_[2] = 0.0;
  (this->crosser_).b_tangent_.c_[0] = 0.0;
  (this->crosser_).b_tangent_.c_[1] = 0.0;
  (this->crosser_).b_tangent_.c_[2] = 0.0;
  (this->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->saved_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->saved_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->saved_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

MutableS2ShapeIndex::InteriorTracker::InteriorTracker()
    : is_active_(false), b_(Origin()),
      next_cellid_(S2CellId::Begin(S2CellId::kMaxLevel)) {
}